

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::post_load_init(CVmObjDict *this,vm_obj_id_t self)

{
  vm_dict_ext *pvVar1;
  undefined4 in_ESI;
  CVmObjDict *in_RDI;
  CVmObjDict *unaff_retaddr;
  vm_obj_id_t comp;
  CVmObjDict *in_stack_00000060;
  CVmObjDict *pCVar2;
  vm_obj_id_t obj;
  
  pCVar2 = in_RDI;
  pvVar1 = get_ext(in_RDI);
  obj = (vm_obj_id_t)((ulong)pCVar2 >> 0x20);
  if (pvVar1->comparator_ != 0) {
    CVmObjTable::ensure_post_load_init
              ((CVmObjTable *)CONCAT44(in_ESI,pvVar1->comparator_),
               (vm_obj_id_t)((ulong)in_RDI >> 0x20));
    set_comparator_type(unaff_retaddr,obj);
    create_hash_table(in_stack_00000060);
  }
  return;
}

Assistant:

void CVmObjDict::post_load_init(VMG_ vm_obj_id_t self)
{
    vm_obj_id_t comp;
    
    /* 
     *   Rebuild the hash table with the comparator, if we have one.  When
     *   we load, reset, or restore, we build a tentative hash table with no
     *   comparator (i.e., the default exact literal comparator), because we
     *   can't assume we have access to the comparator object (as it might
     *   be loaded after us).  So, we register for post-load initialization,
     *   and then we go back and re-install the comparator for real,
     *   rebuilding the hash table with the actual comparator.  
     */
    if ((comp = get_ext()->comparator_) != VM_INVALID_OBJ)
    {
        /* ensure the comparator object is initialized */
        G_obj_table->ensure_post_load_init(vmg_ comp);

        /* set the comparator object type, now that it's loaded */
        set_comparator_type(vmg_ comp);

        /* 
         *   force a rebuild the hash table, so that we build it with the
         *   comparator properly installed 
         */
        create_hash_table(vmg0_);
    }
}